

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

bool __thiscall
Sudoku::fieldCheck(Sudoku *this,
                  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                  FieldVector *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  _List_node_base *p_Var2;
  Field *this_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  pointer psVar8;
  pointer psVar9;
  string local_60;
  pointer local_40;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  psVar9 = (testFields->
           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  psVar8 = (testFields->
           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = psVar8;
  local_38 = furtherWays_;
  if (psVar9 != psVar8) {
    do {
      iVar3 = Field::value((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      if ((iVar3 == 0) &&
         (iVar3 = Field::n_possible((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr), iVar3 == 1)) {
        if (debug) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Field check: field (",0x16);
          Field::pos_abi_cxx11_
                    (&local_60,
                     (psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              (char *)CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                               (int)local_60._M_dataplus._M_p),
                              CONCAT44(local_60._M_string_length._4_4_,
                                       (int)local_60._M_string_length));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") must be ",10);
          iVar3 = Field::onePossibleValue
                            ((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"",0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_60._M_dataplus._M_p._4_4_,(int)local_60._M_dataplus._M_p)
                           );
          }
        }
        p_Var2 = (local_38->
                 super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                 _M_impl._M_node.super__List_node_base._M_prev;
        piVar1 = (int *)((long)&p_Var2[1]._M_prev + 4);
        *piVar1 = *piVar1 + 1;
        iVar3 = Field::id((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        iVar4 = Field::pos_x((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar5 = Field::pos_y((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        iVar6 = Field::pos_z((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ;
        local_60.field_2._M_allocated_capacity._0_4_ =
             Field::onePossibleValue
                       ((psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        local_60.field_2._M_allocated_capacity._4_4_ = 0;
        local_60._M_dataplus._M_p._0_4_ = iVar3;
        local_60._M_dataplus._M_p._4_4_ = iVar4;
        local_60._M_string_length._0_4_ = iVar5;
        local_60._M_string_length._4_4_ = iVar6;
        std::
        _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
        ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                  ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                    *)&p_Var2[2]._M_prev,(Way *)&local_60);
        psVar8 = local_40;
        if (!recordFullFurtherWays) {
          this_00 = (psVar9->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar3 = Field::onePossibleValue(this_00);
          Field::setValue(this_00,iVar3);
          return true;
        }
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar8);
  }
  return false;
}

Assistant:

bool Sudoku::fieldCheck(std::list<FurtherWays> &furtherWays_, FieldVector &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  // check if there are fields that can have only one possible value
  restart = false;

  // loop over fields
  for(auto &testField : testFields)
  {
    if(testField->value() == 0)   // if value is not yet set
    {
      if(testField->n_possible() == 1)    // if there is exactly one possiblility
      {
        if(debug)
          std::cout<<"  Field check: field ("<<testField->pos()<<") must be "<<testField->onePossibleValue()<<""<<std::endl;

        furtherWays_.back().nFieldCheckMatches++;
        furtherWays_.back().addWay(testField->id(), testField->pos_x(), testField->pos_y(), testField->pos_z(),
          testField->onePossibleValue(), FurtherWays::Reason::onlyPossibilityInField);

        if(!recordFullFurtherWays)
        {
          testField->setValue(testField->onePossibleValue());
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}